

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void spr_read_601_rtcu(DisasContext_conflict10 *ctx,int gprn,int sprn)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGTemp *local_8;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  local_8 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  tcg_gen_callN_ppc64(tcg_ctx,helper_load_601_rtcu_ppc64,
                      (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)cpu_gpr[gprn]),1,&local_8);
  return;
}

Assistant:

static void spr_read_601_rtcu(DisasContext *ctx, int gprn, int sprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    gen_helper_load_601_rtcu(tcg_ctx, cpu_gpr[gprn], tcg_ctx->cpu_env);
}